

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_watch_dir(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_timer_t *puVar2;
  char *pcVar3;
  int iVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar5;
  char *__s1;
  uv_fs_event_t *puVar6;
  uv_fs_event_t *puVar7;
  uv_timer_t *puVar8;
  uv_fs_event_t *puVar9;
  uv_fs_event_t auStack_3d8 [3];
  uv_timer_t *puStack_220;
  code *pcStack_218;
  char *pcStack_210;
  char acStack_1e8 [432];
  code *pcStack_38;
  uv_timer_t *puStack_28;
  
  puVar2 = (uv_timer_t *)uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  pcVar3 = (char *)puVar2;
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  if (iVar1 == 0) {
    puVar7 = &fs_event;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_dir_multi_file,"watch_dir",0);
    pcVar3 = (char *)puVar7;
    if (iVar1 != 0) goto LAB_001591c4;
    pcVar3 = (char *)puVar2;
    iVar1 = uv_timer_init(puVar2,&timer);
    if (iVar1 != 0) goto LAB_001591c9;
    puVar8 = &timer;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    pcVar3 = (char *)puVar8;
    if (iVar1 != 0) goto LAB_001591ce;
    pcVar3 = (char *)puVar2;
    uv_run(puVar2,0);
    if (fs_event_cb_called != fs_event_removed + fs_event_created) goto LAB_001591d3;
    if (close_cb_called != 2) goto LAB_001591d8;
    fs_event_unlink_files((uv_timer_t *)0x0);
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    puVar2 = (uv_timer_t *)uv_default_loop();
    uv_walk(puVar2,close_walk_cb,0);
    uv_run(puVar2,0);
    pcVar3 = (char *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_watch_dir_cold_1();
LAB_001591c4:
    run_test_fs_event_watch_dir_cold_2();
LAB_001591c9:
    run_test_fs_event_watch_dir_cold_3();
LAB_001591ce:
    run_test_fs_event_watch_dir_cold_4();
LAB_001591d3:
    run_test_fs_event_watch_dir_cold_5();
LAB_001591d8:
    run_test_fs_event_watch_dir_cold_6();
  }
  run_test_fs_event_watch_dir_cold_7();
  puStack_28 = puVar2;
  if ((uv_timer_t *)pcVar3 == (uv_timer_t *)0x0) {
LAB_0015926a:
    uVar5 = 0;
    do {
      pcStack_38 = (code *)0x159299;
      snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-",(ulong)uVar5);
      pcStack_38 = (code *)0x1592a1;
      iVar1 = remove(fs_event_filename);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x10);
    return iVar1;
  }
  if (fs_event_removed < 0x10) {
    pcStack_38 = (code *)0x159223;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    pcVar3 = fs_event_filename;
    pcStack_38 = (code *)0x15922b;
    iVar1 = remove(fs_event_filename);
    if (iVar1 == 0) {
      if (0xe < fs_event_removed) {
        iVar1 = fs_event_removed;
        fs_event_removed = fs_event_removed + 1;
        return iVar1;
      }
      pcStack_38 = (code *)0x159261;
      fs_event_removed = fs_event_removed + 1;
      iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
      if (iVar1 == 0) {
        return 0;
      }
      pcStack_38 = (code *)0x15926a;
      fs_event_unlink_files_cold_3();
      goto LAB_0015926a;
    }
  }
  else {
    pcStack_38 = (code *)0x1592b8;
    fs_event_unlink_files_cold_1();
  }
  pcStack_38 = create_dir;
  fs_event_unlink_files_cold_2();
  __s1 = acStack_1e8;
  puVar7 = (uv_fs_event_t *)0x0;
  iVar4 = 0x1ed;
  iVar1 = uv_fs_mkdir(0,acStack_1e8,pcVar3,0x1ed,0);
  if ((iVar1 == -0x11) || (iVar1 == 0)) {
    iVar1 = uv_fs_req_cleanup(acStack_1e8);
    return iVar1;
  }
  create_dir_cold_1();
  uVar5 = fs_event_cb_called + 1;
  pcVar3 = (char *)(ulong)uVar5;
  fs_event_cb_called = uVar5;
  if (puVar7 == &fs_event) {
    if (iVar4 != 0) goto LAB_001593aa;
    if (1 < extraout_EDX - 1U) goto LAB_001593af;
    iVar1 = strncmp(__s1,"fsevent-",8);
    if (iVar1 == 0) {
      iVar1 = fs_event_removed + fs_event_created;
      if (iVar1 == 0x10) {
        iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        if (iVar1 == 0) {
          return 0;
        }
        fs_event_cb_dir_multi_file_cold_5();
        iVar1 = extraout_EAX;
      }
      if (uVar5 != 0x20) {
        return iVar1;
      }
      uv_close(&timer,close_cb);
      iVar1 = uv_close(&fs_event,close_cb);
      return iVar1;
    }
  }
  else {
    fs_event_cb_dir_multi_file_cold_1();
LAB_001593aa:
    fs_event_cb_dir_multi_file_cold_2();
LAB_001593af:
    fs_event_cb_dir_multi_file_cold_3();
  }
  fs_event_cb_dir_multi_file_cold_4();
  if (fs_event_created < 0x10) {
    pcVar3 = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    iVar1 = fs_event_created;
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return iVar1;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,1,0);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_218 = (code *)0x15943b;
  pcStack_210 = pcVar3;
  puVar8 = (uv_timer_t *)uv_default_loop();
  pcStack_218 = (code *)0x15944d;
  remove("watch_dir/file2");
  pcStack_218 = (code *)0x15945c;
  remove("watch_dir/file1");
  pcStack_218 = (code *)0x159468;
  remove("watch_dir/");
  pcStack_218 = (code *)0x159474;
  create_dir("watch_dir");
  pcStack_218 = (code *)0x15947c;
  create_file("watch_dir/file1");
  pcStack_218 = (code *)0x159484;
  create_file("watch_dir/file2");
  pcStack_218 = (code *)0x159493;
  puVar2 = puVar8;
  iVar1 = uv_fs_event_init(puVar8,&fs_event);
  if (iVar1 == 0) {
    puVar7 = &fs_event;
    pcStack_218 = (code *)0x1594b7;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    puVar2 = (uv_timer_t *)puVar7;
    if (iVar1 != 0) goto LAB_00159596;
    pcStack_218 = (code *)0x1594ce;
    puVar2 = puVar8;
    iVar1 = uv_timer_init(puVar8,&timer);
    if (iVar1 != 0) goto LAB_0015959b;
    puVar2 = &timer;
    pcStack_218 = (code *)0x1594f3;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    if (iVar1 != 0) goto LAB_001595a0;
    pcStack_218 = (code *)0x159505;
    puVar2 = puVar8;
    uv_run(puVar8,0);
    if (fs_event_cb_called != 1) goto LAB_001595a5;
    if (timer_cb_called != 2) goto LAB_001595aa;
    if (close_cb_called != 2) goto LAB_001595af;
    pcStack_218 = (code *)0x159538;
    remove("watch_dir/file2");
    pcStack_218 = (code *)0x159544;
    remove("watch_dir/file1");
    pcStack_218 = (code *)0x159550;
    remove("watch_dir/");
    pcStack_218 = (code *)0x159555;
    puVar8 = (uv_timer_t *)uv_default_loop();
    pcStack_218 = (code *)0x159569;
    uv_walk(puVar8,close_walk_cb,0);
    pcStack_218 = (code *)0x159573;
    uv_run(puVar8,0);
    pcStack_218 = (code *)0x159578;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_218 = (code *)0x159580;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      pcStack_218 = (code *)0x159589;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_218 = (code *)0x159596;
    run_test_fs_event_watch_file_cold_1();
LAB_00159596:
    pcStack_218 = (code *)0x15959b;
    run_test_fs_event_watch_file_cold_2();
LAB_0015959b:
    pcStack_218 = (code *)0x1595a0;
    run_test_fs_event_watch_file_cold_3();
LAB_001595a0:
    pcStack_218 = (code *)0x1595a5;
    run_test_fs_event_watch_file_cold_4();
LAB_001595a5:
    pcStack_218 = (code *)0x1595aa;
    run_test_fs_event_watch_file_cold_5();
LAB_001595aa:
    pcStack_218 = (code *)0x1595af;
    run_test_fs_event_watch_file_cold_6();
LAB_001595af:
    pcStack_218 = (code *)0x1595b4;
    run_test_fs_event_watch_file_cold_7();
  }
  pcStack_218 = create_file;
  run_test_fs_event_watch_file_cold_8();
  pcStack_218 = (code *)0x1920de;
  puVar7 = auStack_3d8;
  puVar6 = auStack_3d8;
  puVar9 = (uv_fs_event_t *)0x0;
  iVar4 = 0x41;
  puStack_220 = puVar8;
  iVar1 = uv_fs_open(0,auStack_3d8,puVar2,0x41,0x180,0);
  if (iVar1 < 0) {
    create_file_cold_1();
  }
  else {
    uv_fs_req_cleanup();
    puVar9 = (uv_fs_event_t *)0x0;
    iVar4 = 0;
    iVar1 = uv_fs_close(0,auStack_3d8,iVar1);
    puVar7 = puVar6;
    if (iVar1 == 0) {
      iVar1 = uv_fs_req_cleanup(auStack_3d8);
      return iVar1;
    }
  }
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar9 == &fs_event) {
    if (iVar4 != 0) goto LAB_00159679;
    if (extraout_EDX_00 != 2) goto LAB_0015967e;
    iVar1 = strcmp((char *)puVar7,"file2");
    if (iVar1 == 0) {
      puVar7 = &fs_event;
      iVar1 = uv_fs_event_stop(&fs_event);
      if (iVar1 == 0) {
        iVar1 = uv_close(&fs_event,close_cb);
        return iVar1;
      }
      goto LAB_00159688;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_00159679:
    fs_event_cb_file_cold_2();
LAB_0015967e:
    puVar7 = puVar9;
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00159688:
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return extraout_EAX_00;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  iVar1 = uv_close(puVar7,close_cb);
  return iVar1;
}

Assistant:

TEST_IMPL(fs_event_watch_dir) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#elif defined(__MVS__)
  RETURN_SKIP("Directory watching not supported on this platform.");
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  fs_event_unlink_files(NULL);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_dir_multi_file, "watch_dir", 0);
  ASSERT(r == 0);
  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);
  r = uv_timer_start(&timer, fs_event_create_files, 100, 0);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(fs_event_cb_called == fs_event_created + fs_event_removed);
  ASSERT(close_cb_called == 2);

  /* Cleanup */
  fs_event_unlink_files(NULL);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY();
  return 0;
}